

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O2

wchar_t scan_items(object **item_list,size_t item_max,player *p,wchar_t mode,item_tester tester)

{
  ushort uVar1;
  _Bool _Var2;
  object **items;
  object *poVar3;
  long lVar4;
  wchar_t wVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = z_info->floor_size;
  items = (object **)mem_zalloc((ulong)((uint)uVar1 * 8));
  if ((mode & 2U) == 0) {
    uVar7 = 0;
  }
  else {
    uVar6 = 0;
    uVar7 = 0;
    while ((uVar6 < z_info->pack_size && (uVar7 < item_max))) {
      _Var2 = object_test(tester,p->upkeep->inven[uVar6]);
      if (_Var2) {
        item_list[uVar7] = p->upkeep->inven[uVar6];
        uVar7 = uVar7 + 1;
      }
      uVar6 = uVar6 + 1;
    }
  }
  if ((mode & 1U) != 0) {
    wVar5 = L'\0';
    while (((uint)wVar5 < (uint)(p->body).count && (uVar7 < item_max))) {
      poVar3 = slot_object(p,wVar5);
      _Var2 = object_test(tester,poVar3);
      if (_Var2) {
        poVar3 = slot_object(p,wVar5);
        item_list[uVar7] = poVar3;
        uVar7 = uVar7 + 1;
      }
      wVar5 = wVar5 + L'\x01';
    }
  }
  if ((mode & 8U) != 0) {
    uVar6 = 0;
    while ((uVar6 < z_info->quiver_size && (uVar7 < item_max))) {
      _Var2 = object_test(tester,p->upkeep->quiver[uVar6]);
      if (_Var2) {
        item_list[uVar7] = p->upkeep->quiver[uVar6];
        uVar7 = uVar7 + 1;
      }
      uVar6 = uVar6 + 1;
    }
  }
  uVar6 = uVar7;
  if ((mode & 4U) != 0) {
    wVar5 = scan_floor(items,(uint)uVar1,p,OFLOOR_VISIBLE|OFLOOR_SENSE|OFLOOR_TEST,tester);
    for (lVar4 = 0; (uVar6 = uVar7 + lVar4, lVar4 < wVar5 && (uVar6 < item_max)); lVar4 = lVar4 + 1)
    {
      item_list[uVar7 + lVar4] = items[lVar4];
    }
  }
  mem_free(items);
  return (wchar_t)uVar6;
}

Assistant:

int scan_items(struct object **item_list, size_t item_max, struct player *p,
		int mode, item_tester tester)
{
	bool use_inven = ((mode & USE_INVEN) ? true : false);
	bool use_equip = ((mode & USE_EQUIP) ? true : false);
	bool use_quiver = ((mode & USE_QUIVER) ? true : false);
	bool use_floor = ((mode & USE_FLOOR) ? true : false);

	int floor_max = z_info->floor_size;
	struct object **floor_list = mem_zalloc(floor_max * sizeof(struct object *));
	int floor_num;

	int i;
	size_t item_num = 0;

	if (use_inven)
		for (i = 0; i < z_info->pack_size && item_num < item_max; i++) {
			if (object_test(tester, p->upkeep->inven[i]))
				item_list[item_num++] = p->upkeep->inven[i];
		}

	if (use_equip)
		for (i = 0; i < p->body.count && item_num < item_max; i++) {
			if (object_test(tester, slot_object(p, i)))
				item_list[item_num++] = slot_object(p, i);
		}

	if (use_quiver)
		for (i = 0; i < z_info->quiver_size && item_num < item_max; i++) {
			if (object_test(tester, p->upkeep->quiver[i]))
				item_list[item_num++] = p->upkeep->quiver[i];
		}

	/* Scan all non-gold objects in the grid */
	if (use_floor) {
		floor_num = scan_floor(floor_list, floor_max, p,
			OFLOOR_TEST | OFLOOR_SENSE | OFLOOR_VISIBLE, tester);

		for (i = 0; i < floor_num && item_num < item_max; i++)
			item_list[item_num++] = floor_list[i];
	}

	mem_free(floor_list);
	return item_num;
}